

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void stb__stb_idict_rehash(stb_idict *a,int count)

{
  uint k;
  int in_R9D;
  long lVar1;
  stb_idict b;
  stb_idict local_50;
  
  stb_idict_init(&local_50,count);
  if (0 < a->limit) {
    lVar1 = 0;
    do {
      k = a->table[lVar1].k;
      if ((k | 2) != 3) {
        stb__stb_idict_addset(&local_50,k,a->table[lVar1].v,1,1,in_R9D);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < a->limit);
  }
  free(a->table);
  a->table = local_50.table;
  a->mask = local_50.mask;
  a->count = local_50.count;
  a->limit = local_50.limit;
  a->deleted = local_50.deleted;
  a->delete_threshhold = local_50.delete_threshhold;
  a->grow_threshhold = local_50.grow_threshhold;
  a->shrink_threshhold = local_50.shrink_threshhold;
  return;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}